

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

timestamp_ns_t
duckdb::VectorTryCastOperator<duckdb::TryCastToTimestampNS>::
Operation<duckdb::date_t,duckdb::timestamp_ns_t>
          (date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  timestamp_ns_t tVar2;
  PhysicalType type;
  PhysicalType type_00;
  timestamp_ns_t output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  bVar1 = TryCastToTimestampNS::Operation<duckdb::date_t,duckdb::timestamp_ns_t>
                    (input,&output,false);
  if (!bVar1) {
    TypeIdToString_abi_cxx11_(&local_48,(duckdb *)0x7,type);
    ::std::operator+(&local_c8,"Type ",&local_48);
    ::std::operator+(&local_a8,&local_c8," with value ");
    ConvertToString::Operation<duckdb::date_t>(&local_e8,input);
    ::std::operator+(&local_88,&local_a8,&local_e8);
    ::std::operator+(&local_68,&local_88," can\'t be cast to the destination type ");
    TypeIdToString_abi_cxx11_(&local_108,(duckdb *)0x9,type_00);
    ::std::operator+(&local_128,&local_68,&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_48);
    tVar2 = HandleVectorCastError::Operation<duckdb::timestamp_ns_t>
                      (&local_128,mask,idx,(VectorTryCastData *)dataptr);
    ::std::__cxx11::string::~string((string *)&local_128);
    output = tVar2;
  }
  return (timestamp_t)output.super_timestamp_t.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}